

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O1

MethodHandle * __thiscall
jsonrpccxx::GetHandle<WarehouseServer,std::vector<Product,std::allocator<Product>>>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          offset_in_WarehouseServer_to_subr method,WarehouseServer *instance)

{
  function<std::vector<Product,_std::allocator<Product>_>_()> *f;
  function<std::vector<Product,_std::allocator<Product>_>_()> function;
  _Any_data _Stack_68;
  _Manager_type local_58;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(WarehouseServer **)local_48._M_unused._0_8_ = instance;
  *(jsonrpccxx **)((long)local_48._M_unused._0_8_ + 8) = this;
  *(offset_in_WarehouseServer_to_subr *)((long)local_48._M_unused._0_8_ + 0x10) = method;
  pcStack_30 = std::
               _Function_handler<std::vector<Product,_std::allocator<Product>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/include/jsonrpccxx/typemapper.hpp:187:57)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<std::vector<Product,_std::allocator<Product>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/include/jsonrpccxx/typemapper.hpp:187:57)>
             ::_M_manager;
  std::function<std::vector<Product,_std::allocator<Product>_>_()>::function
            ((function<std::vector<Product,_std::allocator<Product>_>_()> *)&_Stack_68,
             (function<std::vector<Product,_std::allocator<Product>_>_()> *)&local_48);
  GetHandle<std::vector<Product,std::allocator<Product>>>
            (__return_storage_ptr__,(jsonrpccxx *)_Stack_68._M_pod_data,f);
  if (local_58 != (code *)0x0) {
    (*local_58)(&_Stack_68,&_Stack_68,__destroy_functor);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(ReturnType (T::*method)(ParamTypes...), T &instance) {
    std::function<ReturnType(ParamTypes...)> function = [&instance, method](ParamTypes &&... params) -> ReturnType {
      return (instance.*method)(std::forward<ParamTypes>(params)...);
    };
    return GetHandle(function);
  }